

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O1

void Mvc_ListAddCubeHead_(Mvc_List_t *pList,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pMVar1;
  
  if (pList->pHead == (Mvc_Cube_t *)0x0) {
    pCube->pNext = (Mvc_Cube_t *)0x0;
    pList->pHead = pCube;
    pMVar1 = (Mvc_List_t *)&pList->pTail;
  }
  else {
    pCube->pNext = pList->pHead;
    pMVar1 = pList;
  }
  pMVar1->pHead = pCube;
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mvc_ListAddCubeHead_( Mvc_List_t * pList, Mvc_Cube_t * pCube )
{
    if ( pList->pHead == NULL )
    {
        Mvc_CubeSetNext( pCube, NULL );
        pList->pHead = pCube;
        pList->pTail = pCube;
    }
    else
    {
        Mvc_CubeSetNext( pCube, pList->pHead );
        pList->pHead = pCube;
    }
    pList->nItems++;
}